

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::Table
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this)

{
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  Vector<kj::StringPtr>::Vector((Vector<kj::StringPtr> *)this);
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::TreeIndex
            ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)(this + 0x20));
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}